

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

bool __thiscall QPDF::resolveXRefTable(QPDF *this)

{
  bool bVar1;
  bool bVar2;
  pointer pMVar3;
  reference ppVar4;
  pair<const_QPDFObjGen,_QPDFXRefEntry> *iter;
  iterator __end1;
  iterator __begin1;
  map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  *__range1;
  bool may_change;
  QPDF *this_local;
  
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  bVar1 = pMVar3->reconstructed_xref;
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  __end1 = std::
           map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
           ::begin(&pMVar3->xref_table);
  iter = (pair<const_QPDFObjGen,_QPDFXRefEntry> *)
         std::
         map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
         ::end(&pMVar3->xref_table);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&iter);
    if (!bVar2) {
      return true;
    }
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::operator*(&__end1)
    ;
    bVar2 = isUnresolved(this,ppVar4->first);
    if (((bVar2) && (resolve(this,ppVar4->first), ((bVar1 ^ 0xffU) & 1) != 0)) &&
       (pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m), (pMVar3->reconstructed_xref & 1U) != 0)) break;
    std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>::operator++(&__end1);
  }
  return false;
}

Assistant:

bool
QPDF::resolveXRefTable()
{
    bool may_change = !m->reconstructed_xref;
    for (auto& iter: m->xref_table) {
        if (isUnresolved(iter.first)) {
            resolve(iter.first);
            if (may_change && m->reconstructed_xref) {
                return false;
            }
        }
    }
    return true;
}